

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfa.cpp
# Opt level: O0

unique_ptr<mg::data::MappedHfa,_std::default_delete<mg::data::MappedHfa>_> __thiscall
mg::data::MappedHfa::parse(MappedHfa *this,shared_ptr<mg::fs::MappedFile> *backing_data)

{
  undefined8 uVar1;
  int iVar2;
  uint32_t uVar3;
  element_type *peVar4;
  ulong uVar5;
  uint8_t *puVar6;
  MappedHfa *this_00;
  vector<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
  local_110;
  shared_ptr<mg::fs::MappedFile> local_f8;
  undefined1 auStack_e8 [8];
  PackedEntryHeader entry;
  uint8_t *puStack_60;
  uint32_t i;
  PackedEntryHeader *entry_ptr;
  undefined1 local_40 [4];
  uint32_t entry_count;
  vector<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
  entries;
  FileHeader header;
  shared_ptr<mg::fs::MappedFile> *backing_data_local;
  
  peVar4 = std::__shared_ptr_access<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)backing_data);
  uVar5 = fs::MappedFile::size(peVar4);
  if (uVar5 < 0x10) {
    fprintf(_stderr,"File too short to read header\n");
    std::unique_ptr<mg::data::MappedHfa,std::default_delete<mg::data::MappedHfa>>::
    unique_ptr<std::default_delete<mg::data::MappedHfa>,void>
              ((unique_ptr<mg::data::MappedHfa,std::default_delete<mg::data::MappedHfa>> *)this,
               (nullptr_t)0x0);
  }
  else {
    peVar4 = std::__shared_ptr_access<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)backing_data);
    puVar6 = fs::MappedFile::data(peVar4);
    entries.
    super__Vector_base<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)puVar6;
    uVar1 = *(undefined8 *)(puVar6 + 8);
    iVar2 = memcmp(&entries.
                    super__Vector_base<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"HUNEXGGEFA10",0xc);
    if (iVar2 == 0) {
      std::
      vector<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>::
      vector((vector<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
              *)local_40);
      header.magic._4_4_ = SUB84((ulong)uVar1 >> 0x20,0);
      uVar3 = le_to_host_u32(header.magic._4_4_);
      peVar4 = std::
               __shared_ptr_access<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)backing_data);
      puStack_60 = fs::MappedFile::data(peVar4);
      puStack_60 = puStack_60 + 0x10;
      entry._padding[0x14] = '\0';
      entry._padding[0x15] = '\0';
      entry._padding[0x16] = '\0';
      entry._padding[0x17] = '\0';
      for (; (uint)entry._padding._20_4_ < uVar3; entry._padding._20_4_ = entry._padding._20_4_ + 1)
      {
        entry._padding._0_8_ = *(undefined8 *)(puStack_60 + 0x70);
        entry._padding._8_8_ = *(undefined8 *)(puStack_60 + 0x78);
        entry.filename._88_8_ = *(undefined8 *)(puStack_60 + 0x60);
        entry._96_8_ = *(undefined8 *)(puStack_60 + 0x68);
        entry.filename._72_8_ = *(undefined8 *)(puStack_60 + 0x50);
        entry.filename._80_8_ = *(undefined8 *)(puStack_60 + 0x58);
        entry.filename._56_8_ = *(undefined8 *)(puStack_60 + 0x40);
        entry.filename._64_8_ = *(undefined8 *)(puStack_60 + 0x48);
        auStack_e8 = *(undefined1 (*) [8])puStack_60;
        entry.filename._0_8_ = *(undefined8 *)(puStack_60 + 8);
        entry.filename._8_8_ = *(undefined8 *)(puStack_60 + 0x10);
        entry.filename._16_8_ = *(undefined8 *)(puStack_60 + 0x18);
        entry.filename._24_8_ = *(undefined8 *)(puStack_60 + 0x20);
        entry.filename._32_8_ = *(undefined8 *)(puStack_60 + 0x28);
        entry.filename._40_8_ = *(undefined8 *)(puStack_60 + 0x30);
        entry.filename._48_8_ = *(undefined8 *)(puStack_60 + 0x38);
        Hfa::PackedEntryHeader::to_host_order((PackedEntryHeader *)auStack_e8);
        std::
        vector<mg::data::Hfa::PackedEntryHeader,std::allocator<mg::data::Hfa::PackedEntryHeader>>::
        emplace_back<mg::data::Hfa::PackedEntryHeader&>
                  ((vector<mg::data::Hfa::PackedEntryHeader,std::allocator<mg::data::Hfa::PackedEntryHeader>>
                    *)local_40,(PackedEntryHeader *)auStack_e8);
        puStack_60 = puStack_60 + 0x80;
      }
      this_00 = (MappedHfa *)operator_new(0x28);
      std::shared_ptr<mg::fs::MappedFile>::shared_ptr(&local_f8,backing_data);
      std::
      vector<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>::
      vector(&local_110,
             (vector<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
              *)local_40);
      MappedHfa(this_00,&local_f8,&local_110);
      std::unique_ptr<mg::data::MappedHfa,std::default_delete<mg::data::MappedHfa>>::
      unique_ptr<std::default_delete<mg::data::MappedHfa>,void>
                ((unique_ptr<mg::data::MappedHfa,std::default_delete<mg::data::MappedHfa>> *)this,
                 this_00);
      std::
      vector<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>::
      ~vector(&local_110);
      std::shared_ptr<mg::fs::MappedFile>::~shared_ptr(&local_f8);
      std::
      vector<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>::
      ~vector((vector<mg::data::Hfa::PackedEntryHeader,_std::allocator<mg::data::Hfa::PackedEntryHeader>_>
               *)local_40);
    }
    else {
      fprintf(_stderr,"File has invalid magic\n");
      std::unique_ptr<mg::data::MappedHfa,std::default_delete<mg::data::MappedHfa>>::
      unique_ptr<std::default_delete<mg::data::MappedHfa>,void>
                ((unique_ptr<mg::data::MappedHfa,std::default_delete<mg::data::MappedHfa>> *)this,
                 (nullptr_t)0x0);
    }
  }
  return (__uniq_ptr_data<mg::data::MappedHfa,_std::default_delete<mg::data::MappedHfa>,_true,_true>
         )(__uniq_ptr_data<mg::data::MappedHfa,_std::default_delete<mg::data::MappedHfa>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<MappedHfa>
MappedHfa::parse(std::shared_ptr<mg::fs::MappedFile> backing_data) {
  // Check file larger enough to have a header
  if ((size_t)backing_data->size() < sizeof(Hfa::FileHeader)) {
    fprintf(stderr, "File too short to read header\n");
    return nullptr;
  }

  // Check magic is correct
  Hfa::FileHeader header = *(Hfa::FileHeader *)backing_data->data();
  if (!!memcmp(header.magic, Hfa::MAGIC, strlen(Hfa::MAGIC))) {
    fprintf(stderr, "File has invalid magic\n");
    return nullptr;
  }

  // Parse each of the header entries
  std::vector<Hfa::PackedEntryHeader> entries;
  const uint32_t entry_count = le_to_host_u32(header.entry_count);
  const Hfa::PackedEntryHeader *entry_ptr =
      reinterpret_cast<const Hfa::PackedEntryHeader *>(backing_data->data() +
                                                       sizeof(Hfa::FileHeader));
  for (uint32_t i = 0; i < entry_count; i++, entry_ptr++) {
    // Copy the entry, convert it to host order and add it to our entry list
    Hfa::PackedEntryHeader entry = *entry_ptr;
    entry.to_host_order();
    entries.emplace_back(entry);
  }

  return std::unique_ptr<MappedHfa>(new MappedHfa(backing_data, entries));
}